

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Mat3 m_1;
  Mat3 m;
  float local_118 [4];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [2];
  undefined8 local_e0;
  undefined4 local_d8;
  Matrix<float,_3,_3> local_d0;
  int local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  Matrix<float,_3,_3> local_8c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  long lVar7;
  
  pfVar1 = &local_38;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar5 = _DAT_00632fe0;
    do {
      bVar8 = SUB164(auVar5 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar5 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 + -0xc != lVar4) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4 + 0xc) = uVar9;
      }
      lVar7 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x30);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  local_a8 = -0x80000000;
  uStack_a4 = 0x80000000;
  uStack_a0 = 0x80000000;
  uStack_9c = 0x80000000;
  local_38 = evalCtx->in[0].m_data[0];
  fStack_34 = evalCtx->in[0].m_data[1];
  fStack_30 = evalCtx->in[0].m_data[2];
  local_28 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  fStack_2c = evalCtx->in[1].m_data[0];
  local_18 = evalCtx->in[2].m_data[2];
  uStack_20 = *(undefined8 *)evalCtx->in[2].m_data;
  decrement<float,3,3>(&local_8c,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_d0.m_data.m_data[0].m_data[2] = 0.0;
  local_d0.m_data.m_data[0].m_data[0] = 0.0;
  local_d0.m_data.m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    local_d0.m_data.m_data[0].m_data[lVar2] =
         local_8c.m_data.m_data[0].m_data[lVar2] + local_8c.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_108[2] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2] =
         local_d0.m_data.m_data[0].m_data[lVar2] + local_8c.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pfVar1 = &local_68;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar6 = _DAT_00632fe0;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_00625ae0,4) == local_a8 &&
              SUB164(auVar6 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 + -0xc != lVar4) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4 + 0xc) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x30);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  local_68 = evalCtx->in[0].m_data[0];
  fStack_64 = evalCtx->in[0].m_data[1];
  fStack_60 = evalCtx->in[0].m_data[2];
  local_58 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  fStack_5c = evalCtx->in[1].m_data[0];
  local_48 = evalCtx->in[2].m_data[2];
  uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
  decrement<float,3,3>(&local_d0,(MatrixCaseUtils *)&local_68,(Matrix<float,_3,_3> *)0x3);
  local_e0 = (ulong)local_e0._4_4_ << 0x20;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  lVar2 = 0;
  do {
    local_e8[lVar2] =
         local_d0.m_data.m_data[0].m_data[lVar2] + local_d0.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_118[2] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  lVar2 = 0;
  do {
    local_118[lVar2] = local_e8[lVar2] + local_d0.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  lVar2 = 0;
  do {
    local_108[lVar2 + 4] = local_108[lVar2] + local_118[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e0 = 0x100000000;
  local_d8 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_e8[lVar2]] = local_108[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}